

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O2

string * __thiscall
duckdb::FileHandle::ReadLine_abi_cxx11_(string *__return_storage_ptr__,FileHandle *this)

{
  int iVar1;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined8 uStack_28;
  char buffer [1];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uStack_28 = in_RAX;
  while( true ) {
    iVar1 = (*this->file_system->_vptr_FileSystem[5])(this->file_system,this,buffer,1);
    if ((CONCAT44(extraout_var,iVar1) == 0) || (buffer[0] == '\n')) break;
    if (buffer[0] != '\r') {
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string FileHandle::ReadLine() {
	string result;
	char buffer[1];
	while (true) {
		auto tuples_read = UnsafeNumericCast<idx_t>(Read(buffer, 1));
		if (tuples_read == 0 || buffer[0] == '\n') {
			return result;
		}
		if (buffer[0] != '\r') {
			result += buffer[0];
		}
	}
}